

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmp_image.cpp
# Opt level: O0

void __thiscall
Bitmap_Operation::BitmapCoreHeader::get
          (BitmapCoreHeader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data)

{
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  size_t offset;
  size_t *in_stack_ffffffffffffffd8;
  
  set_value<unsigned_int>(in_RDI,in_stack_ffffffffffffffd8,(uint *)0x13d5e4);
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x13d5fc);
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x13d614);
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x13d62c);
  set_value<unsigned_short>(in_RDI,in_stack_ffffffffffffffd8,(unsigned_short *)0x13d644);
  return;
}

Assistant:

void get( std::vector < uint8_t > & data )
        {
            size_t offset = 0;
            set_value( data, offset, bcSize );
            set_value( data, offset, bcWidth );
            set_value( data, offset, bcHeight );
            set_value( data, offset, bcPlanes );
            set_value( data, offset, bcBitCount );
        }